

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O1

Amount __thiscall
cfd::api::TransactionApi::EstimateFee
          (TransactionApi *this,string *tx_hex,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos,Amount *txout_fee,
          Amount *utxo_fee,double effective_fee_rate)

{
  Address *this_00;
  pointer pcVar1;
  long lVar2;
  AddressType AVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t size;
  uint32_t size_00;
  uint uVar6;
  undefined8 extraout_RDX;
  AddressType addr_type;
  uint32_t uVar7;
  NetType type;
  uint uVar8;
  Script *pSVar9;
  pointer pUVar10;
  double dVar11;
  Amount AVar12;
  FeeCalculator fee_calc;
  uint32_t nowit_size;
  uint32_t wit_size;
  Script redeem_script;
  string descriptor;
  AddressFactory_conflict address_factory;
  TransactionContext txc;
  DescriptorScriptData data;
  uint32_t local_530;
  FeeCalculator local_52c;
  uint32_t local_528;
  uint32_t local_524;
  double local_520;
  undefined1 local_518 [16];
  _func_int *local_508 [5];
  string local_4e0;
  Amount local_4c0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_4b0;
  Amount *local_4a8;
  Amount *local_4a0;
  pointer local_498;
  int64_t local_490;
  undefined1 local_488 [16];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_478;
  int64_t local_460;
  Script local_458;
  TransactionContext local_420;
  undefined1 local_368 [448];
  AddressType local_1a8;
  Script local_1a0 [6];
  
  local_520 = effective_fee_rate;
  local_4a8 = txout_fee;
  local_4a0 = utxo_fee;
  TransactionContext::TransactionContext(&local_420,tx_hex);
  uVar8 = 0;
  local_524 = 0;
  local_528 = 0;
  pUVar10 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_498 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  uVar7 = 0;
  local_530 = 0;
  local_4b0 = utxos;
  if (pUVar10 != local_498) {
    local_530 = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      this_00 = &pUVar10->address;
      core::Address::GetAddress_abi_cxx11_((string *)local_368,this_00);
      lVar2 = CONCAT44(local_368._12_4_,local_368._8_4_);
      if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
        operator_delete((void *)local_368._0_8_);
      }
      if (lVar2 == 0) {
        type = kMainnet;
      }
      else {
        type = this_00->type_;
      }
      AddressFactory::AddressFactory((AddressFactory *)local_488,type);
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      pcVar1 = (pUVar10->descriptor)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,pcVar1,pcVar1 + (pUVar10->descriptor)._M_string_length);
      local_518._0_8_ = local_508;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"");
      AddressFactory::ParseOutputDescriptor
                ((DescriptorScriptData *)local_368,(AddressFactory *)local_488,&local_4e0,
                 (string *)local_518,
                 (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                 0x0,(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
                 (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
      if ((_func_int **)local_518._0_8_ != local_508) {
        operator_delete((void *)local_518._0_8_);
      }
      core::Address::GetAddress_abi_cxx11_((string *)local_518,this_00);
      AVar3 = local_1a8;
      if (local_1a8 == kP2shP2wpkhAddress || CONCAT71(local_518._9_7_,local_518[8]) == 0) {
        addr_type = local_1a8;
        if ((_func_int **)local_518._0_8_ != local_508) {
          operator_delete((void *)local_518._0_8_);
          addr_type = local_1a8;
        }
      }
      else {
        if ((_func_int **)local_518._0_8_ != local_508) {
          operator_delete((void *)local_518._0_8_);
        }
        addr_type = local_1a8;
        if (AVar3 != kP2shP2wshAddress) {
          addr_type = (pUVar10->address).addr_type_;
        }
      }
      core::Script::Script((Script *)local_518);
      pSVar9 = &pUVar10->redeem_script;
      bVar4 = core::Script::IsEmpty(pSVar9);
      if (bVar4) {
        bVar4 = core::Script::IsEmpty(local_1a0);
        if (!bVar4) {
          pSVar9 = local_1a0;
        }
      }
      core::Script::operator=((Script *)local_518,pSVar9);
      bVar4 = core::Script::IsEmpty((Script *)local_518);
      if (bVar4 && addr_type != kTaprootAddress) {
        pSVar9 = (Script *)0x0;
      }
      else {
        pSVar9 = &pUVar10->scriptsig_template;
        bVar4 = core::Script::IsEmpty(pSVar9);
        if (bVar4) {
          pSVar9 = (Script *)0x0;
        }
      }
      core::Script::Script(&local_458,(Script *)local_518);
      core::TxIn::EstimateTxInSize(addr_type,&local_458,&local_524,&local_528,pSVar9);
      core::Script::~Script(&local_458);
      uVar5 = local_524;
      local_530 = local_530 + local_528;
      uVar8 = uVar8 + (local_524 == 0);
      core::Script::~Script((Script *)local_518);
      DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p);
      }
      uVar7 = uVar7 + uVar5;
      local_488._0_8_ = &PTR__AddressFactory_00733578;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_478);
      pUVar10 = pUVar10 + 1;
    } while (pUVar10 != local_498);
  }
  uVar5 = TransactionContext::GetSizeIgnoreTxIn(&local_420,uVar7 != 0);
  size = core::AbstractTransaction::GetVsizeFromSize(uVar5,0);
  if (uVar8 != 0 && uVar7 != 0) {
    uVar6 = 0;
    if (uVar8 < (uint)((int)((ulong)((long)(local_4b0->
                                           super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_4b0->
                                          super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      0x613716af)) {
      uVar6 = uVar8;
    }
    uVar7 = uVar7 + uVar6;
  }
  size_00 = core::AbstractTransaction::GetVsizeFromSize(local_530,uVar7);
  dVar11 = floor(local_520 * 1000.0);
  FeeCalculator::FeeCalculator
            (&local_52c,(long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11
            );
  AVar12 = FeeCalculator::GetFee(&local_52c,size);
  local_518._0_8_ = AVar12.amount_;
  local_518[8] = AVar12.ignore_check_;
  AVar12 = FeeCalculator::GetFee(&local_52c,size_00);
  local_488._0_8_ = AVar12.amount_;
  local_488[8] = AVar12.ignore_check_;
  uVar7 = core::AbstractTransaction::GetVsizeFromSize(uVar5 + local_530,uVar7);
  AVar12 = FeeCalculator::GetFee(&local_52c,uVar7);
  local_4c0.amount_ = AVar12.amount_;
  local_4c0.ignore_check_ = AVar12.ignore_check_;
  if (local_4a8 != (Amount *)0x0) {
    local_4a8->ignore_check_ = local_518[8];
    local_4a8->amount_ = local_518._0_8_;
  }
  if (local_4a0 != (Amount *)0x0) {
    local_4a0->ignore_check_ = local_488[8];
    local_4a0->amount_ = local_488._0_8_;
  }
  local_368._0_8_ = "cfdapi_transaction.cpp";
  local_368._8_4_ = 0x121;
  local_368._16_8_ = (long)"CfdInitializeEstimateFee" + 0xd;
  local_4e0._M_dataplus._M_p = (pointer)core::Amount::GetSatoshiValue(&local_4c0);
  local_490 = core::Amount::GetSatoshiValue((Amount *)local_518);
  local_460 = core::Amount::GetSatoshiValue((Amount *)local_488);
  core::logger::log<double&,long&,long&,long&>
            ((CfdSourceLocation *)local_368,kCfdLogLevelInfo,
             "EstimateFee rate={} fee={} tx={} utxo={}",&local_520,(long *)&local_4e0,&local_490,
             &local_460);
  TransactionContext::~TransactionContext(&local_420);
  AVar12._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar12.ignore_check_ = local_4c0.ignore_check_;
  AVar12.amount_ = local_4c0.amount_;
  return AVar12;
}

Assistant:

Amount TransactionApi::EstimateFee(
    const std::string& tx_hex, const std::vector<UtxoData>& utxos,
    Amount* txout_fee, Amount* utxo_fee, double effective_fee_rate) const {
  TransactionContext txc(tx_hex);

  uint32_t size = 0;
  uint32_t witness_size = 0;
  uint32_t wit_size = 0;
  uint32_t nowit_size = 0;
  uint32_t not_witness_count = 0;
  for (const auto& utxo : utxos) {
    NetType net_type = NetType::kMainnet;
    if (!utxo.address.GetAddress().empty()) {
      net_type = utxo.address.GetNetType();
    }
    AddressFactory address_factory(net_type);
    // check descriptor
    std::string descriptor = utxo.descriptor;
    // set dummy NetType for getting AddressType.
    auto data = address_factory.ParseOutputDescriptor(descriptor);

    AddressType addr_type;
    if (utxo.address.GetAddress().empty() ||
        data.address_type == AddressType::kP2shP2wpkhAddress ||
        data.address_type == AddressType::kP2shP2wshAddress) {
      addr_type = data.address_type;
    } else {
      addr_type = utxo.address.GetAddressType();
    }

    Script redeem_script;
    if (utxo.redeem_script.IsEmpty() && !data.redeem_script.IsEmpty()) {
      redeem_script = data.redeem_script;
    } else {
      redeem_script = utxo.redeem_script;
    }
    const Script* scriptsig_template = nullptr;
    if (((!redeem_script.IsEmpty()) ||
         (addr_type == AddressType::kTaprootAddress)) &&
        (!utxo.scriptsig_template.IsEmpty())) {
      scriptsig_template = &utxo.scriptsig_template;
    }

    TxIn::EstimateTxInSize(
        addr_type, redeem_script, &wit_size, &nowit_size, scriptsig_template);
    size += nowit_size;
    witness_size += wit_size;
    if (wit_size == 0) ++not_witness_count;
  }

  uint32_t tx_size = txc.GetSizeIgnoreTxIn((witness_size != 0));
  uint32_t tx_vsize = AbstractTransaction::GetVsizeFromSize(tx_size, 0);

  if ((witness_size != 0) && (not_witness_count != 0) &&
      (not_witness_count < static_cast<uint32_t>(utxos.size()))) {
    // append witness size for p2pkh or p2sh
    witness_size += not_witness_count;
  }

  uint32_t utxo_vsize =
      AbstractTransaction::GetVsizeFromSize(size, witness_size);

  uint64_t fee_rate = static_cast<uint64_t>(floor(effective_fee_rate * 1000));
  FeeCalculator fee_calc(fee_rate);
  Amount tx_fee_amount = fee_calc.GetFee(tx_vsize);
  Amount utxo_fee_amount = fee_calc.GetFee(utxo_vsize);
  uint32_t total_size = tx_size + size;
  uint32_t total_vsize =
      AbstractTransaction::GetVsizeFromSize(total_size, witness_size);
  Amount fee = fee_calc.GetFee(total_vsize);

  if (txout_fee) *txout_fee = tx_fee_amount;
  if (utxo_fee) *utxo_fee = utxo_fee_amount;

  info(
      CFD_LOG_SOURCE, "EstimateFee rate={} fee={} tx={} utxo={}",
      effective_fee_rate, fee.GetSatoshiValue(),
      tx_fee_amount.GetSatoshiValue(), utxo_fee_amount.GetSatoshiValue());
  return fee;
}